

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_transfer.c
# Opt level: O0

void psr_transfer(arm7tdmi_t *state,arminstr_t *arminstr)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  status_register_t *psVar5;
  uint *in_RSI;
  arm7tdmi_t *in_RDI;
  status_register_t *psr_1;
  uint32_t psr;
  uint32_t spsr;
  uint source_register;
  uint32_t shift;
  msr_immediate_flags_t flags;
  uint32_t source_data;
  uint32_t mask;
  field_masks_t field_masks;
  anon_union_4_2_77b2f900 opcode;
  uint dt_operand2;
  uint dt_rd;
  uint dt_rn;
  uint dt_opcode;
  _Bool immediate;
  uint32_t value;
  uint32_t in_stack_ffffffffffffff2c;
  arm7tdmi_t *in_stack_ffffffffffffff30;
  status_register_t *local_c0;
  uint32_t local_8c;
  field_masks_t local_84;
  byte local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  byte local_69;
  arm7tdmi_t *local_60;
  uint32_t local_58;
  uint local_54;
  arm7tdmi_t *local_50;
  uint local_48;
  uint local_44;
  arm7tdmi_t *local_40;
  arm7tdmi_t *local_38;
  uint32_t local_2c;
  arm7tdmi_t *local_28;
  uint32_t local_20;
  
  local_69 = (byte)(*in_RSI >> 0x19) & 1;
  uVar3 = *in_RSI >> 0x15;
  local_70 = uVar3 & 0xf;
  local_74 = *in_RSI >> 0x10 & 0xf;
  local_78 = *in_RSI >> 0xc & 0xf;
  local_7c = *in_RSI & 0xfff;
  local_80 = local_80 & 0xf0 | (byte)local_70;
  local_60 = in_RDI;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 2) == 0) {
      local_c0 = get_psr(in_RDI);
    }
    else {
      local_c0 = get_spsr(in_RDI);
    }
    local_48 = local_c0->raw;
    local_40 = local_60;
    local_44 = local_78;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_78,(ulong)local_48);
    }
    if (((((local_40->cpsr).raw & 0x1f) == 0x11) && (7 < local_44)) && (local_44 < 0xd)) {
      local_40->highreg_fiq[local_44 - 8] = local_48;
    }
    else if (local_44 < 0xd) {
      local_40->r[local_44] = local_48;
    }
    else if (local_44 == 0xd) {
      switch((local_40->cpsr).raw & 0x1f) {
      case 0x11:
        local_40->sp_fiq = local_48;
        break;
      case 0x12:
        local_40->sp_irq = local_48;
        break;
      case 0x13:
        local_40->sp_svc = local_48;
        break;
      default:
        local_40->sp = local_48;
        break;
      case 0x17:
        local_40->sp_abt = local_48;
        break;
      case 0x1b:
        local_40->sp_und = local_48;
      }
    }
    else if (local_44 == 0xe) {
      switch((local_40->cpsr).raw & 0x1f) {
      case 0x11:
        local_40->lr_fiq = local_48;
        break;
      case 0x12:
        local_40->lr_irq = local_48;
        break;
      case 0x13:
        local_40->lr_svc = local_48;
        break;
      default:
        local_40->lr = local_48;
        break;
      case 0x17:
        local_40->lr_abt = local_48;
        break;
      case 0x1b:
        local_40->lr_und = local_48;
      }
    }
    else {
      if (local_44 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_44);
        exit(1);
      }
      if (((local_40->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
      else {
        set_pc(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
    }
  }
  else {
    local_84.raw = local_84.raw & 0xf0 | (byte)local_74;
    uVar4 = get_mask(&local_84);
    if ((local_69 & 1) == 0) {
      local_54 = local_7c & 0xf;
      local_50 = local_60;
      local_58 = 0;
      if (((((local_60->cpsr).raw & 0x1f) == 0x11) && (7 < local_54)) && (local_54 < 0xd)) {
        local_58 = local_60->highreg_fiq[local_54 - 8];
      }
      else if (local_54 < 0xd) {
        local_58 = local_60->r[local_54];
      }
      else if (local_54 == 0xd) {
        local_38 = local_60;
        switch((local_60->cpsr).raw & 0x1f) {
        case 0x11:
          local_2c = local_60->sp_fiq;
          break;
        case 0x12:
          local_2c = local_60->sp_irq;
          break;
        case 0x13:
          local_2c = local_60->sp_svc;
          break;
        default:
          local_2c = local_60->sp;
          break;
        case 0x17:
          local_2c = local_60->sp_abt;
          break;
        case 0x1b:
          local_2c = local_60->sp_und;
        }
        local_58 = local_2c;
      }
      else if (local_54 == 0xe) {
        local_28 = local_60;
        switch((local_60->cpsr).raw & 0x1f) {
        case 0x11:
          local_20 = local_60->lr_fiq;
          break;
        case 0x12:
          local_20 = local_60->lr_irq;
          break;
        case 0x13:
          local_20 = local_60->lr_svc;
          break;
        default:
          local_20 = local_60->lr;
          break;
        case 0x17:
          local_20 = local_60->lr_abt;
          break;
        case 0x1b:
          local_20 = local_60->lr_und;
        }
        local_58 = local_20;
      }
      else {
        if (local_54 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_54);
          exit(1);
        }
        local_58 = local_60->pc;
      }
      local_8c = local_58;
    }
    else {
      uVar1 = (ushort)local_7c & 0xff;
      bVar2 = (byte)(local_7c >> 8) & 0xf;
      local_8c = (uint)(uVar1 >> bVar2 * '\x02') | (uint)uVar1 << (bVar2 * -2 & 0x1f);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Source data: 0x%08X\n",(ulong)local_8c);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Mask: 0x%08X\n",(ulong)uVar4);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Source data masked: 0x%08X\n",(ulong)(uVar4 & local_8c));
    }
    if ((local_80 >> 1 & 1) == 0) {
      psVar5 = get_psr(local_60);
      set_psr(local_60,psVar5->raw & (uVar4 ^ 0xffffffff) | uVar4 & local_8c);
    }
    else {
      get_spsr(local_60);
      set_spsr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
  }
  return;
}

Assistant:

void psr_transfer(arm7tdmi_t* state, arminstr_t* arminstr) {
    bool immediate = arminstr->parsed.DATA_PROCESSING.immediate;
    unsigned int dt_opcode = arminstr->parsed.DATA_PROCESSING.opcode;
    unsigned int dt_rn = arminstr->parsed.DATA_PROCESSING.rn;
    unsigned int dt_rd = arminstr->parsed.DATA_PROCESSING.rd;
    unsigned int dt_operand2 = arminstr->parsed.DATA_PROCESSING.operand2;
    union {
        struct {
            bool msr:1; // if 0, mrs, if 1, msr
            bool spsr:1; // if 0, cpsr, if 1, spsr_current mode
            unsigned:2;
        };
        unsigned raw:4;
    } opcode;
    opcode.raw = dt_opcode;

    if (opcode.msr) {
        field_masks_t field_masks;
        field_masks.raw = dt_rn; // field masks come from the "rn" field in data processing
        word mask = get_mask(&field_masks);

        word source_data;

        if (immediate) {
            msr_immediate_flags_t flags;
            flags.raw = dt_operand2;
            source_data = flags.parsed.imm;
            word shift = flags.parsed.shift * 2;

            shift &= 31u;
            source_data = (source_data >> shift) | (source_data << (-shift & 31u));
        }
        else {
            unsigned int source_register = dt_operand2 & 0b1111u;
            source_data = get_register(state, source_register);
        }

        logdebug("Source data: 0x%08X", source_data)
        source_data &= mask;
        logdebug("Mask: 0x%08X", mask)
        logdebug("Source data masked: 0x%08X", source_data)
        if (opcode.spsr) { // SPSR
            word spsr = get_spsr(state)->raw;
            spsr = (spsr & ~mask) | source_data;
            set_spsr(state, spsr);
        }
        else { // CPSR
            word psr = get_psr(state)->raw;
            psr = (psr & ~mask) | source_data;
            set_psr(state, psr);
        }
    }
    else {
        // MRS
        status_register_t* psr = opcode.spsr ? get_spsr(state) : get_psr(state);
        set_register(state, dt_rd, psr->raw);
    }

}